

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O2

int saisxx_private::
    suffixsort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,long fs,
              long n,long k,bool isbwt)

{
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var19;
  bool bVar20;
  long local_60;
  
  if (fs < k) {
    lVar11 = 0;
    plVar6 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long*,long>
              (T,plVar6,n,k);
    getBuckets<long*,long>(plVar6,plVar6,k,true);
    lVar8 = 0;
    if (0 < n) {
      lVar8 = n;
    }
    for (; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      SA._M_current[lVar11] = 0;
    }
    iVar5 = 0;
    uVar7 = T._M_current[n + -1];
    for (lVar11 = n + -2; -1 < lVar11; lVar11 = lVar11 + -1) {
      uVar2 = T._M_current[lVar11];
      iVar4 = 1;
      if ((iVar5 + uVar7 <= uVar2) && (iVar4 = 0, iVar5 != 0)) {
        lVar12 = plVar6[uVar7];
        plVar6[uVar7] = lVar12 + -1;
        SA._M_current[lVar12 + -1] = lVar11 + 1;
      }
      iVar5 = iVar4;
      uVar7 = uVar2;
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
              (T,SA,plVar6,plVar6,n,k);
    operator_delete__(plVar6);
  }
  else {
    _Var19._M_current = SA._M_current + n;
    lVar11 = 0;
    lVar8 = k;
    if (fs - k < k) {
      lVar8 = lVar11;
    }
    _Var1._M_current = _Var19._M_current + lVar8;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,_Var19,n,k);
    getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (_Var19,_Var1,k,true);
    lVar8 = 0;
    if (0 < n) {
      lVar8 = n;
    }
    for (; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      SA._M_current[lVar11] = 0;
    }
    iVar5 = 0;
    uVar7 = T._M_current[n + -1];
    for (lVar11 = n + -2; -1 < lVar11; lVar11 = lVar11 + -1) {
      uVar2 = T._M_current[lVar11];
      iVar4 = 1;
      if ((iVar5 + uVar7 <= uVar2) && (iVar4 = 0, iVar5 != 0)) {
        lVar12 = _Var1._M_current[uVar7];
        _Var1._M_current[uVar7] = lVar12 + -1;
        SA._M_current[lVar12 + -1] = lVar11 + 1;
      }
      iVar5 = iVar4;
      uVar7 = uVar2;
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,SA,_Var19,_Var1,n,k);
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 != lVar8; lVar11 = lVar11 + 1) {
    lVar15 = SA._M_current[lVar11];
    if ((0 < lVar15) &&
       (uVar7 = T._M_current[lVar15], lVar16 = lVar15, uVar7 < T._M_current[lVar15 + -1])) {
      do {
        lVar16 = lVar16 + 1;
        if (n <= lVar16) goto LAB_0017e874;
      } while (uVar7 == T._M_current[lVar16]);
      if (uVar7 < T._M_current[lVar16]) {
        SA._M_current[lVar12] = lVar15;
        lVar12 = lVar12 + 1;
      }
    }
LAB_0017e874:
  }
  lVar11 = (n >> 1) + lVar12;
  for (lVar8 = lVar12; lVar8 < lVar11; lVar8 = lVar8 + 1) {
    SA._M_current[lVar8] = 0;
  }
  lVar15 = -n;
  iVar5 = 0;
  lVar8 = n + -2;
  uVar18 = n;
  uVar7 = T._M_current[n + -1];
  for (lVar16 = lVar8; lVar15 = lVar15 + 1, -1 < lVar16; lVar16 = lVar16 + -1) {
    uVar2 = T._M_current[lVar16];
    if (uVar2 < uVar7 + iVar5) {
      iVar5 = 1;
    }
    else {
      bVar20 = iVar5 != 0;
      iVar5 = 0;
      if (bVar20) {
        lVar17 = uVar18 + lVar15;
        uVar18 = lVar16 + 1;
        *(SA._M_current + (uVar18 & 0xfffffffffffffffe) * 4 + lVar12 * 8) = lVar17;
        iVar5 = 0;
      }
    }
    uVar7 = uVar2;
  }
  lVar16 = 0;
  lVar15 = 0;
  if (0 < lVar12) {
    lVar15 = lVar12;
  }
  lVar17 = 0;
  lVar9 = 0;
  local_60 = n;
  do {
    if (lVar9 == lVar15) {
      if (lVar16 < lVar12) {
        _Var19._M_current = SA._M_current + n + (fs - lVar12);
        lVar17 = lVar12 + -1;
        lVar9 = lVar17;
        while (lVar12 < lVar11) {
          lVar3 = lVar11 + -1;
          lVar11 = lVar11 + -1;
          if (SA._M_current[lVar3] != 0) {
            _Var19._M_current[lVar9] = SA._M_current[lVar3] + -1;
            lVar9 = lVar9 + -1;
          }
        }
        iVar5 = 0;
        iVar4 = suffixsort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                          (_Var19,SA,n + fs + lVar12 * -2,lVar12,lVar16,false);
        if (iVar4 != 0) {
          return -2;
        }
        uVar7 = T._M_current[n + -1];
        for (; -1 < lVar8; lVar8 = lVar8 + -1) {
          uVar2 = T._M_current[lVar8];
          if (uVar2 < uVar7 + iVar5) {
            iVar5 = 1;
          }
          else {
            bVar20 = iVar5 != 0;
            iVar5 = 0;
            if (bVar20) {
              _Var19._M_current[lVar17] = lVar8 + 1;
              lVar17 = lVar17 + -1;
            }
          }
          uVar7 = uVar2;
        }
        for (lVar8 = 0; lVar15 != lVar8; lVar8 = lVar8 + 1) {
          SA._M_current[lVar8] = _Var19._M_current[SA._M_current[lVar8]];
        }
      }
      if (fs < k) {
        plVar6 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
        getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long*,long>
                  (T,plVar6,n,k);
        getBuckets<long*,long>(plVar6,plVar6,k,true);
        for (lVar8 = lVar12; lVar8 < n; lVar8 = lVar8 + 1) {
          SA._M_current[lVar8] = 0;
        }
        for (; 0 < lVar12; lVar12 = lVar12 + -1) {
          lVar8 = SA._M_current[lVar12 + -1];
          SA._M_current[lVar12 + -1] = 0;
          lVar11 = plVar6[T._M_current[lVar8]];
          plVar6[T._M_current[lVar8]] = lVar11 + -1;
          SA._M_current[lVar11 + -1] = lVar8;
        }
        if (isbwt) {
          iVar5 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                            (T,SA,plVar6,plVar6,n,k);
        }
        else {
          induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                    (T,SA,plVar6,plVar6,n,k);
          iVar5 = 0;
        }
        operator_delete__(plVar6);
      }
      else {
        _Var19._M_current = SA._M_current + n;
        lVar8 = 0;
        if (k <= fs - k) {
          lVar8 = k;
        }
        _Var1._M_current = _Var19._M_current + lVar8;
        getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                  (T,_Var19,n,k);
        getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                  (_Var19,_Var1,k,true);
        for (lVar8 = lVar12; lVar8 < n; lVar8 = lVar8 + 1) {
          SA._M_current[lVar8] = 0;
        }
        for (; 0 < lVar12; lVar12 = lVar12 + -1) {
          lVar8 = SA._M_current[lVar12 + -1];
          SA._M_current[lVar12 + -1] = 0;
          lVar11 = _Var1._M_current[T._M_current[lVar8]];
          _Var1._M_current[T._M_current[lVar8]] = lVar11 + -1;
          SA._M_current[lVar11 + -1] = lVar8;
        }
        if (isbwt) {
          iVar5 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                            (T,SA,_Var19,_Var1,n,k);
          return iVar5;
        }
        induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                  (T,SA,_Var19,_Var1,n,k);
        iVar5 = 0;
      }
      return iVar5;
    }
    lVar3 = SA._M_current[lVar9];
    if (SA._M_current[lVar12 + (lVar3 >> 1)] == lVar17) {
      lVar13 = 0;
      if (0 < lVar17) {
        lVar13 = lVar17;
      }
      for (lVar10 = 0;
          (lVar14 = lVar13, lVar13 != lVar10 &&
          (lVar14 = lVar10, T._M_current[lVar3 + lVar10] == T._M_current[local_60 + lVar10]));
          lVar10 = lVar10 + 1) {
      }
      if (lVar14 != lVar17) goto LAB_0017e983;
    }
    else {
LAB_0017e983:
      lVar16 = lVar16 + 1;
      lVar17 = SA._M_current[lVar12 + (lVar3 >> 1)];
      local_60 = lVar3;
    }
    SA._M_current[lVar12 + (lVar3 >> 1)] = lVar16;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int
suffixsort(string_type T, sarray_type SA,
           index_type fs, index_type n, index_type k,
           bool isbwt) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type RA;
  index_type i, j, m, p, q, plen, qlen, name;
  int pidx = 0;
  bool diff;
  int c;
#ifdef _OPENMP
  int maxthreads = omp_get_max_threads();
#else
# define maxthreads 1
#endif
  char_type c0, c1;

  /* stage 1: reduce the problem by at least 1/2
     sort all the S-substrings */
  if(fs < (maxthreads * k)) {
    index_type *C, *B;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
  }

  /* compact all the sorted substrings into the first m items of SA
     2*m must be not larger than n (proveable) */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i, j, p, c0, c1)
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[i] = ~p; }
    }
  }
  for(i = 0, m = 0; i < n; ++i) { if((p = SA[i]) < 0) { SA[m++] = ~p; } }
#else
  for(i = 0, m = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[m++] = p; }
    }
  }
#endif
  j = m + (n >> 1);
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
  for(i = m; i < j; ++i) { SA[i] = 0; } /* init the name array buffer */
  /* store the length of all substrings */
  for(i = n - 2, j = n, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
    if((c0 = T[i]) < (c1 + c)) { c = 1; }
    else if(c != 0) { SA[m + ((i + 1) >> 1)] = j - i - 1; j = i + 1; c = 0; }
  }
  /* find the lexicographic names of all substrings */
  for(i = 0, name = 0, q = n, qlen = 0; i < m; ++i) {
    p = SA[i], plen = SA[m + (p >> 1)], diff = true;
    if(plen == qlen) {
      for(j = 0; (j < plen) && (T[p + j] == T[q + j]); ++j) { }
      if(j == plen) { diff = false; }
    }
    if(diff != false) { ++name, q = p, qlen = plen; }
    SA[m + (p >> 1)] = name;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    RA = SA + n + fs - m;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) { RA[j--] = SA[i] - 1; }
    }
    if(suffixsort(RA, SA, fs + n - m * 2, m, name, false) != 0) { return -2; }
    for(i = n - 2, j = m - 1, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { RA[j--] = i + 1, c = 0; } /* get p1 */
    }
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < m; ++i) { SA[i] = RA[SA[i]]; } /* get index in s */
  }

  /* stage 3: induce the result for the original problem */
  if(fs < (maxthreads * k)) {
    index_type *B, *C;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
  }

  return pidx;
#ifndef _OPENMP
# undef maxthreads
#endif
}